

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall
wasm::Literal::countTrailingZeroes(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  int iVar2;
  
  uVar1 = (this->type).id;
  if (uVar1 == 3) {
    iVar2 = Bits::countTrailingZeroes((this->field_0).func.super_IString.str._M_len);
    *(long *)&__return_storage_ptr__->field_0 = (long)iVar2;
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x294);
    }
    iVar2 = Bits::countTrailingZeroes((this->field_0).i32);
    (__return_storage_ptr__->field_0).i32 = iVar2;
  }
  (__return_storage_ptr__->type).id = uVar1;
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::countTrailingZeroes() const {
  if (type == Type::i32) {
    return Literal((int32_t)Bits::countTrailingZeroes(i32));
  }
  if (type == Type::i64) {
    return Literal((int64_t)Bits::countTrailingZeroes(i64));
  }
  WASM_UNREACHABLE("invalid type");
}